

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_retry_control.c
# Opt level: O3

int retry_control_should_retry(RETRY_CONTROL_HANDLE retry_control_handle,RETRY_ACTION *retry_action)

{
  uint uVar1;
  LOGGER_LOG p_Var2;
  time_t tVar3;
  int iVar4;
  int iVar5;
  RETRY_CONTROL_INSTANCE *retry_control;
  char *pcVar6;
  double dVar7;
  
  if (retry_control_handle == (RETRY_CONTROL_HANDLE)0x0 || retry_action == (RETRY_ACTION *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_retry_control.c"
                ,"retry_control_should_retry",0x15c,1,
                "Failed to evaluate if retry should be attempted (either retry_control_handle (%p) or retry_action (%p) are NULL)"
                ,retry_control_handle,retry_action);
      return 0x15d;
    }
    return 0x15d;
  }
  if (retry_control_handle->policy == IOTHUB_CLIENT_RETRY_NONE) {
LAB_00143881:
    *retry_action = RETRY_ACTION_STOP_RETRYING;
    return 0;
  }
  if (retry_control_handle->first_retry_tick_seconds == -1) {
    tVar3 = retry_get_tick_seconds((RETRY_CONTROL_INSTANCE *)retry_control_handle->tick_counter);
    retry_control_handle->first_retry_tick_seconds = tVar3;
    if (tVar3 == -1) {
      p_Var2 = xlogging_get_log_function();
      iVar4 = 0x16b;
      if (p_Var2 == (LOGGER_LOG)0x0) {
        return 0x16b;
      }
      pcVar6 = "Failed to evaluate if retry should be attempted (retry_get_tick_seconds() failed)";
      iVar5 = 0x16a;
      goto LAB_00143986;
    }
  }
  if (retry_control_handle->retry_count == 0) {
LAB_0014388f:
    *retry_action = RETRY_ACTION_RETRY_NOW;
    retry_control_handle->retry_count = retry_control_handle->retry_count + 1;
    if (retry_control_handle->policy != IOTHUB_CLIENT_RETRY_IMMEDIATE) {
      tVar3 = retry_get_tick_seconds((RETRY_CONTROL_INSTANCE *)retry_control_handle->tick_counter);
      retry_control_handle->last_retry_tick_seconds = tVar3;
      uVar1 = calculate_next_wait_time(retry_control_handle);
      retry_control_handle->current_wait_time_in_secs = uVar1;
      return 0;
    }
    return 0;
  }
  if ((retry_control_handle->last_retry_tick_seconds == -1) &&
     (retry_control_handle->policy != IOTHUB_CLIENT_RETRY_IMMEDIATE)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      pcVar6 = "Failed to evaluate retry action (last_retry_tick_second is INDEFINITE_TIME)";
      iVar4 = 0x7e;
LAB_0014394d:
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_retry_control.c"
                ,"evaluate_retry_action",iVar4,1,pcVar6);
    }
  }
  else {
    tVar3 = retry_get_tick_seconds((RETRY_CONTROL_INSTANCE *)retry_control_handle->tick_counter);
    if (tVar3 != -1) {
      if ((retry_control_handle->max_retry_time_in_secs != 0) &&
         (dVar7 = get_difftime(tVar3,retry_control_handle->first_retry_tick_seconds),
         (double)retry_control_handle->max_retry_time_in_secs <= dVar7)) goto LAB_00143881;
      if ((retry_control_handle->policy != IOTHUB_CLIENT_RETRY_IMMEDIATE) &&
         (dVar7 = get_difftime(tVar3,retry_control_handle->last_retry_tick_seconds),
         dVar7 < (double)retry_control_handle->current_wait_time_in_secs)) {
        *retry_action = RETRY_ACTION_RETRY_LATER;
        return 0;
      }
      goto LAB_0014388f;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      pcVar6 = "Failed to evaluate retry action (retry_get_tick_seconds() failed)";
      iVar4 = 0x87;
      goto LAB_0014394d;
    }
  }
  p_Var2 = xlogging_get_log_function();
  iVar4 = 0x170;
  if (p_Var2 == (LOGGER_LOG)0x0) {
    return 0x170;
  }
  pcVar6 = "Failed to evaluate if retry should be attempted (evaluate_retry_action() failed)";
  iVar5 = 0x16f;
LAB_00143986:
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_retry_control.c"
            ,"retry_control_should_retry",iVar5,1,pcVar6);
  return iVar4;
}

Assistant:

int retry_control_should_retry(RETRY_CONTROL_HANDLE retry_control_handle, RETRY_ACTION* retry_action)
{
    int result;

    if ((retry_control_handle == NULL) || (retry_action == NULL))
    {
        LogError("Failed to evaluate if retry should be attempted (either retry_control_handle (%p) or retry_action (%p) are NULL)", retry_control_handle, retry_action);
        result = MU_FAILURE;
    }
    else
    {
        RETRY_CONTROL_INSTANCE* retry_control = (RETRY_CONTROL_INSTANCE*)retry_control_handle;

        if (retry_control->policy == IOTHUB_CLIENT_RETRY_NONE)
        {
            *retry_action = RETRY_ACTION_STOP_RETRYING;
            result = RESULT_OK;
        }
        else if (retry_control->first_retry_tick_seconds == INDEFINITE_TIME && (retry_control->first_retry_tick_seconds = retry_get_tick_seconds(retry_control_handle)) == INDEFINITE_TIME)
        {
            LogError("Failed to evaluate if retry should be attempted (retry_get_tick_seconds() failed)");
            result = MU_FAILURE;
        }
        else if (evaluate_retry_action(retry_control, retry_action) != RESULT_OK)
        {
            LogError("Failed to evaluate if retry should be attempted (evaluate_retry_action() failed)");
            result = MU_FAILURE;
        }
        else
        {
            if (*retry_action == RETRY_ACTION_RETRY_NOW)
            {
                retry_control->retry_count++;

                if (retry_control->policy != IOTHUB_CLIENT_RETRY_IMMEDIATE)
                {
                    retry_control->last_retry_tick_seconds = retry_get_tick_seconds(retry_control_handle);

                    retry_control->current_wait_time_in_secs = calculate_next_wait_time(retry_control);
                }
            }

            result = RESULT_OK;
        }
    }

    return result;
}